

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined1 local_a8 [8];
  Buffer buffer;
  thread local_30;
  thread producerAThread;
  thread producerBThread;
  thread consumeAThread;
  thread consumeBThread;
  
  Buffer::Buffer((Buffer *)local_a8);
  producerAThread._M_id._M_thread = (id)(id)local_a8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&local_30,produceA,(reference_wrapper<Buffer> *)&producerAThread,
             &PRODUCER_A_SLEEP_IN_SECONDS);
  producerBThread._M_id._M_thread = (id)(id)local_a8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&producerAThread,produceB,(reference_wrapper<Buffer> *)&producerBThread,
             &PRODUCER_B_SLEEP_IN_SECONDS);
  consumeAThread._M_id._M_thread = (id)(id)local_a8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&producerBThread,consumeA,(reference_wrapper<Buffer> *)&consumeAThread,
             &CONSUMER_A_SLEEP_IN_SECONDS);
  buffer._104_8_ = local_a8;
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&consumeAThread,consumeB,(reference_wrapper<Buffer> *)(buffer.buffer + 4),
             &CONSUMER_B_SLEEP_IN_SECONDS);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&consumeAThread);
  std::thread::~thread(&producerBThread);
  std::thread::~thread(&producerAThread);
  std::thread::~thread(&local_30);
  Buffer::~Buffer((Buffer *)local_a8);
  return 0;
}

Assistant:

int main() {
    Buffer buffer;

    auto producerAThread = std::thread(produceA, std::ref(buffer), PRODUCER_A_SLEEP_IN_SECONDS);
    auto producerBThread = std::thread(produceB, std::ref(buffer), PRODUCER_B_SLEEP_IN_SECONDS);
    auto consumeAThread = std::thread(consumeA, std::ref(buffer), CONSUMER_A_SLEEP_IN_SECONDS);
    auto consumeBThread = std::thread(consumeB, std::ref(buffer), CONSUMER_B_SLEEP_IN_SECONDS);

    producerAThread.join();
    producerBThread.join();
    consumeAThread.join();
    consumeBThread.join();
    return 0;
}